

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.c
# Opt level: O0

void opt_peep(opt_state_t *opt_state,block *b)

{
  bpf_int32 bVar1;
  uint uVar2;
  slist *psVar3;
  slist *psVar4;
  slist *psVar5;
  uint local_58;
  bpf_int32 v_1;
  bpf_int32 v;
  slist *ild;
  slist *tax;
  slist *add;
  int val;
  slist *last;
  slist *next;
  slist *s;
  block *b_local;
  opt_state_t *opt_state_local;
  
  next = b->stmts;
  if (b->stmts != (slist *)0x0) {
    while ((psVar3 = this_op(next), psVar3 != (slist *)0x0 &&
           (psVar4 = this_op(psVar3->next), psVar4 != (slist *)0x0))) {
      if ((((psVar3->s).code == 2) && ((psVar4->s).code == 0x61)) &&
         ((psVar3->s).k == (psVar4->s).k)) {
        opt_state->done = 0;
        (psVar4->s).code = 7;
      }
      if (((psVar3->s).code == 0) && ((psVar4->s).code == 7)) {
        (psVar3->s).code = 1;
        (psVar4->s).code = 0x87;
        opt_state->done = 0;
      }
      next = psVar4;
      if (((psVar3->s).code == 0) && ((b->out_use & 0x20000) == 0)) {
        tax = psVar4;
        if ((psVar4->s).code == 0xb1) {
          tax = this_op(psVar4->next);
        }
        if (((((tax != (slist *)0x0) && ((tax->s).code == 0xc)) &&
             (psVar4 = this_op(tax->next), psVar4 != (slist *)0x0)) &&
            (((psVar4->s).code == 7 && (psVar5 = this_op(psVar4->next), psVar5 != (slist *)0x0))))
           && ((((psVar5->s).code & 7U) == 0 && (((psVar5->s).code & 0xe0U) == 0x40)))) {
          (psVar5->s).k = (psVar3->s).k + (psVar5->s).k;
          (psVar3->s).code = -1;
          (tax->s).code = -1;
          (psVar4->s).code = -1;
          opt_state->done = 0;
        }
      }
    }
    if (((b->s).code == 0x15) && ((b->out_use & 0x10000) == 0)) {
      if ((next->s).code == 0x1c) {
        if (opt_state->vmap[b->val[0x11]].is_const == 0) {
          if ((b->s).k == 0) {
            (next->s).code = -1;
            (b->s).code = 0x1d;
            opt_state->done = 0;
          }
        }
        else {
          (b->s).k = opt_state->vmap[b->val[0x11]].const_val + (b->s).k;
          (next->s).code = -1;
          opt_state->done = 0;
        }
      }
      else if ((next->s).code == 0x14) {
        (next->s).code = -1;
        (b->s).k = (next->s).k + (b->s).k;
        opt_state->done = 0;
      }
      else if (((next->s).code == 0x54) && ((b->s).k == 0)) {
        (b->s).k = (next->s).k;
        (b->s).code = 0x45;
        (next->s).code = -1;
        opt_state->done = 0;
        opt_not(b);
      }
    }
    if ((b->s).code == 0x45) {
      if ((b->s).k == 0) {
        (b->et).succ = (b->ef).succ;
      }
      if ((b->s).k == -1) {
        (b->ef).succ = (b->et).succ;
      }
    }
    if ((opt_state->vmap[b->val[0x11]].is_const != 0) && (((b->s).code & 8U) == 8)) {
      bVar1 = opt_state->vmap[b->val[0x11]].const_val;
      (b->s).code = (b->s).code & 0xfffffff7;
      (b->s).k = bVar1;
    }
    if ((opt_state->vmap[b->val[0x10]].is_const != 0) && (((b->s).code & 8U) == 0)) {
      local_58 = opt_state->vmap[b->val[0x10]].const_val;
      uVar2 = (b->s).code & 0xf0;
      if (uVar2 == 0x10) {
        local_58 = (uint)(local_58 == (b->s).k);
      }
      else if (uVar2 == 0x20) {
        local_58 = (uint)((uint)(b->s).k < local_58);
      }
      else if (uVar2 == 0x30) {
        local_58 = (uint)((uint)(b->s).k <= local_58);
      }
      else {
        if (uVar2 != 0x40) {
          abort();
        }
        local_58 = (b->s).k & local_58;
      }
      if ((b->ef).succ != (b->et).succ) {
        opt_state->done = 0;
      }
      if (local_58 == 0) {
        (b->et).succ = (b->ef).succ;
      }
      else {
        (b->ef).succ = (b->et).succ;
      }
    }
  }
  return;
}

Assistant:

static void
opt_peep(opt_state_t *opt_state, struct block *b)
{
	struct slist *s;
	struct slist *next, *last;
	int val;

	s = b->stmts;
	if (s == 0)
		return;

	last = s;
	for (/*empty*/; /*empty*/; s = next) {
		/*
		 * Skip over nops.
		 */
		s = this_op(s);
		if (s == 0)
			break;	/* nothing left in the block */

		/*
		 * Find the next real instruction after that one
		 * (skipping nops).
		 */
		next = this_op(s->next);
		if (next == 0)
			break;	/* no next instruction */
		last = next;

		/*
		 * st  M[k]	-->	st  M[k]
		 * ldx M[k]		tax
		 */
		if (s->s.code == BPF_ST &&
		    next->s.code == (BPF_LDX|BPF_MEM) &&
		    s->s.k == next->s.k) {
			opt_state->done = 0;
			next->s.code = BPF_MISC|BPF_TAX;
		}
		/*
		 * ld  #k	-->	ldx  #k
		 * tax			txa
		 */
		if (s->s.code == (BPF_LD|BPF_IMM) &&
		    next->s.code == (BPF_MISC|BPF_TAX)) {
			s->s.code = BPF_LDX|BPF_IMM;
			next->s.code = BPF_MISC|BPF_TXA;
			opt_state->done = 0;
		}
		/*
		 * This is an ugly special case, but it happens
		 * when you say tcp[k] or udp[k] where k is a constant.
		 */
		if (s->s.code == (BPF_LD|BPF_IMM)) {
			struct slist *add, *tax, *ild;

			/*
			 * Check that X isn't used on exit from this
			 * block (which the optimizer might cause).
			 * We know the code generator won't generate
			 * any local dependencies.
			 */
			if (ATOMELEM(b->out_use, X_ATOM))
				continue;

			/*
			 * Check that the instruction following the ldi
			 * is an addx, or it's an ldxms with an addx
			 * following it (with 0 or more nops between the
			 * ldxms and addx).
			 */
			if (next->s.code != (BPF_LDX|BPF_MSH|BPF_B))
				add = next;
			else
				add = this_op(next->next);
			if (add == 0 || add->s.code != (BPF_ALU|BPF_ADD|BPF_X))
				continue;

			/*
			 * Check that a tax follows that (with 0 or more
			 * nops between them).
			 */
			tax = this_op(add->next);
			if (tax == 0 || tax->s.code != (BPF_MISC|BPF_TAX))
				continue;

			/*
			 * Check that an ild follows that (with 0 or more
			 * nops between them).
			 */
			ild = this_op(tax->next);
			if (ild == 0 || BPF_CLASS(ild->s.code) != BPF_LD ||
			    BPF_MODE(ild->s.code) != BPF_IND)
				continue;
			/*
			 * We want to turn this sequence:
			 *
			 * (004) ldi     #0x2		{s}
			 * (005) ldxms   [14]		{next}  -- optional
			 * (006) addx			{add}
			 * (007) tax			{tax}
			 * (008) ild     [x+0]		{ild}
			 *
			 * into this sequence:
			 *
			 * (004) nop
			 * (005) ldxms   [14]
			 * (006) nop
			 * (007) nop
			 * (008) ild     [x+2]
			 *
			 * XXX We need to check that X is not
			 * subsequently used, because we want to change
			 * what'll be in it after this sequence.
			 *
			 * We know we can eliminate the accumulator
			 * modifications earlier in the sequence since
			 * it is defined by the last stmt of this sequence
			 * (i.e., the last statement of the sequence loads
			 * a value into the accumulator, so we can eliminate
			 * earlier operations on the accumulator).
			 */
			ild->s.k += s->s.k;
			s->s.code = NOP;
			add->s.code = NOP;
			tax->s.code = NOP;
			opt_state->done = 0;
		}
	}
	/*
	 * If the comparison at the end of a block is an equality
	 * comparison against a constant, and nobody uses the value
	 * we leave in the A register at the end of a block, and
	 * the operation preceding the comparison is an arithmetic
	 * operation, we can sometime optimize it away.
	 */
	if (b->s.code == (BPF_JMP|BPF_JEQ|BPF_K) &&
	    !ATOMELEM(b->out_use, A_ATOM)) {
	    	/*
	    	 * We can optimize away certain subtractions of the
	    	 * X register.
	    	 */
		if (last->s.code == (BPF_ALU|BPF_SUB|BPF_X)) {
			val = b->val[X_ATOM];
			if (opt_state->vmap[val].is_const) {
				/*
				 * If we have a subtract to do a comparison,
				 * and the X register is a known constant,
				 * we can merge this value into the
				 * comparison:
				 *
				 * sub x  ->	nop
				 * jeq #y	jeq #(x+y)
				 */
				b->s.k += opt_state->vmap[val].const_val;
				last->s.code = NOP;
				opt_state->done = 0;
			} else if (b->s.k == 0) {
				/*
				 * If the X register isn't a constant,
				 * and the comparison in the test is
				 * against 0, we can compare with the
				 * X register, instead:
				 *
				 * sub x  ->	nop
				 * jeq #0	jeq x
				 */
				last->s.code = NOP;
				b->s.code = BPF_JMP|BPF_JEQ|BPF_X;
				opt_state->done = 0;
			}
		}
		/*
		 * Likewise, a constant subtract can be simplified:
		 *
		 * sub #x ->	nop
		 * jeq #y ->	jeq #(x+y)
		 */
		else if (last->s.code == (BPF_ALU|BPF_SUB|BPF_K)) {
			last->s.code = NOP;
			b->s.k += last->s.k;
			opt_state->done = 0;
		}
		/*
		 * And, similarly, a constant AND can be simplified
		 * if we're testing against 0, i.e.:
		 *
		 * and #k	nop
		 * jeq #0  ->	jset #k
		 */
		else if (last->s.code == (BPF_ALU|BPF_AND|BPF_K) &&
		    b->s.k == 0) {
			b->s.k = last->s.k;
			b->s.code = BPF_JMP|BPF_K|BPF_JSET;
			last->s.code = NOP;
			opt_state->done = 0;
			opt_not(b);
		}
	}
	/*
	 * jset #0        ->   never
	 * jset #ffffffff ->   always
	 */
	if (b->s.code == (BPF_JMP|BPF_K|BPF_JSET)) {
		if (b->s.k == 0)
			JT(b) = JF(b);
		if ((u_int)b->s.k == 0xffffffffU)
			JF(b) = JT(b);
	}
	/*
	 * If we're comparing against the index register, and the index
	 * register is a known constant, we can just compare against that
	 * constant.
	 */
	val = b->val[X_ATOM];
	if (opt_state->vmap[val].is_const && BPF_SRC(b->s.code) == BPF_X) {
		bpf_int32 v = opt_state->vmap[val].const_val;
		b->s.code &= ~BPF_X;
		b->s.k = v;
	}
	/*
	 * If the accumulator is a known constant, we can compute the
	 * comparison result.
	 */
	val = b->val[A_ATOM];
	if (opt_state->vmap[val].is_const && BPF_SRC(b->s.code) == BPF_K) {
		bpf_int32 v = opt_state->vmap[val].const_val;
		switch (BPF_OP(b->s.code)) {

		case BPF_JEQ:
			v = v == b->s.k;
			break;

		case BPF_JGT:
			v = (unsigned)v > (unsigned)b->s.k;
			break;

		case BPF_JGE:
			v = (unsigned)v >= (unsigned)b->s.k;
			break;

		case BPF_JSET:
			v &= b->s.k;
			break;

		default:
			abort();
		}
		if (JF(b) != JT(b))
			opt_state->done = 0;
		if (v)
			JF(b) = JT(b);
		else
			JT(b) = JF(b);
	}
}